

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::End(ByteCodeWriter *this)

{
  code *pcVar1;
  anon_class_24_3_a5c534a8_for_fn fn;
  anon_class_24_3_cb34e669_for_fn fn_00;
  anon_class_24_3_cb67d1c1_for_fn fn_01;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  ScriptContext *pSVar7;
  FunctionBody *pFVar8;
  ByteBlock *local_98;
  ByteBlock *finalAuxiliaryContextBlock;
  ByteBlock *finalAuxiliaryBlock;
  byte *local_80;
  uint local_78;
  undefined4 uStack_74;
  uint local_6c;
  uint uStack_68;
  uint rootObjectStoreInlineCacheStart;
  byte *local_60;
  uint local_58;
  undefined4 uStack_54;
  uint local_4c;
  uint uStack_48;
  uint rootObjectLoadMethodInlineCacheStart;
  byte *local_40;
  uint local_38;
  undefined4 uStack_34;
  uint local_30;
  uint local_2c;
  uint rootObjectLoadInlineCacheStart;
  uint byteCount;
  byte *byteBuffer;
  ScriptContext *scriptContext;
  ByteBlock *finalByteCodeBlock;
  ByteCodeWriter *this_local;
  
  finalByteCodeBlock = (ByteBlock *)this;
  if ((this->isInUse & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x87,"(isInUse)","isInUse");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  CheckOpen(this);
  Empty(this,EndOfBlock);
  scriptContext = (ScriptContext *)0x0;
  byteBuffer = (byte *)FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
  pRVar6 = ScriptContext::GetRecycler((ScriptContext *)byteBuffer);
  Data::Copy(&this->m_byteCodeData,pRVar6,(ByteBlock **)&scriptContext);
  _rootObjectLoadInlineCacheStart = ByteBlock::GetBuffer((ByteBlock *)scriptContext);
  local_2c = Data::GetCurrentOffset(&this->m_byteCodeData);
  if ((this->useBranchIsland & 1U) == 0) {
    PatchJumpOffset<int>(this,this->m_jumpOffsets,_rootObjectLoadInlineCacheStart,local_2c);
  }
  else {
    PatchJumpOffset<short>(this,this->m_jumpOffsets,_rootObjectLoadInlineCacheStart,local_2c);
    PatchJumpOffset<int>(this,this->m_longJumpOffsets,_rootObjectLoadInlineCacheStart,local_2c);
  }
  local_38 = FunctionBody::GetRootObjectLoadInlineCacheStart(this->m_functionWrite);
  uStack_48 = local_2c;
  local_40 = _rootObjectLoadInlineCacheStart;
  fn._20_4_ = uStack_34;
  fn.rootObjectLoadInlineCacheStart = local_38;
  fn._4_4_ = rootObjectLoadMethodInlineCacheStart;
  fn.byteCount = local_2c;
  fn.byteBuffer = _rootObjectLoadInlineCacheStart;
  local_30 = local_38;
  SListBase<unsigned_long,Memory::ArenaAllocator,RealCount>::Map<Js::ByteCodeWriter::End()::__0>
            ((SListBase<unsigned_long,Memory::ArenaAllocator,RealCount> *)
             &this->rootObjectLoadInlineCacheOffsets,fn);
  local_58 = FunctionBody::GetRootObjectLoadMethodInlineCacheStart(this->m_functionWrite);
  uStack_68 = local_2c;
  local_60 = _rootObjectLoadInlineCacheStart;
  fn_00._20_4_ = uStack_54;
  fn_00.rootObjectLoadMethodInlineCacheStart = local_58;
  fn_00._4_4_ = rootObjectStoreInlineCacheStart;
  fn_00.byteCount = local_2c;
  fn_00.byteBuffer = _rootObjectLoadInlineCacheStart;
  local_4c = local_58;
  SListBase<unsigned_long,Memory::ArenaAllocator,RealCount>::Map<Js::ByteCodeWriter::End()::__1>
            ((SListBase<unsigned_long,Memory::ArenaAllocator,RealCount> *)
             &this->rootObjectLoadMethodInlineCacheOffsets,fn_00);
  local_78 = FunctionBody::GetRootObjectStoreInlineCacheStart(this->m_functionWrite);
  finalAuxiliaryBlock._0_4_ = local_2c;
  local_80 = _rootObjectLoadInlineCacheStart;
  fn_01._20_4_ = uStack_74;
  fn_01.rootObjectStoreInlineCacheStart = local_78;
  fn_01._4_4_ = finalAuxiliaryBlock._4_4_;
  fn_01.byteCount = local_2c;
  fn_01.byteBuffer = _rootObjectLoadInlineCacheStart;
  local_6c = local_78;
  SListBase<unsigned_long,Memory::ArenaAllocator,RealCount>::Map<Js::ByteCodeWriter::End()::__2>
            ((SListBase<unsigned_long,Memory::ArenaAllocator,RealCount> *)
             &this->rootObjectStoreInlineCacheOffsets,fn_01);
  finalAuxiliaryContextBlock = (ByteBlock *)0x0;
  local_98 = (ByteBlock *)0x0;
  pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
  pRVar6 = ScriptContext::GetRecycler(pSVar7);
  Data::Copy(&this->m_auxiliaryData,pRVar6,&finalAuxiliaryContextBlock);
  pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
  pRVar6 = ScriptContext::GetRecycler(pSVar7);
  Data::Copy(&this->m_auxContextData,pRVar6,&local_98);
  FunctionBody::AllocateInlineCache(this->m_functionWrite);
  FunctionBody::AllocateObjectLiteralTypeArray(this->m_functionWrite);
  FunctionBody::AllocateForInCache(this->m_functionWrite);
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ScriptFunctionWithInlineCachePhase,uVar3,LVar4);
  if (!bVar2) {
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
    LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineApplyTargetPhase,uVar3,LVar4);
    if ((!bVar2) &&
       (bVar2 = FunctionBody::CanFunctionObjectHaveInlineCaches(this->m_functionWrite), bVar2)) {
      FunctionBody::SetInlineCachesOnFunctionObject(this->m_functionWrite,true);
    }
  }
  bVar2 = DoJitLoopBodies(this);
  if ((bVar2) && (bVar2 = HasLoopWithoutYield(this), bVar2)) {
    pFVar8 = FunctionProxy::GetFunctionBody((FunctionProxy *)this->m_functionWrite);
    bVar2 = ParseableFunctionInfo::GetHasTry(&pFVar8->super_ParseableFunctionInfo);
    if (bVar2) {
      uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,JITLoopBodyInTryCatchPhase,uVar3,LVar4);
      if (bVar2) goto LAB_00c2a033;
    }
    pFVar8 = FunctionProxy::GetFunctionBody((FunctionProxy *)this->m_functionWrite);
    bVar2 = FunctionBody::GetHasFinally(pFVar8);
    if (bVar2) {
      uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,JITLoopBodyInTryFinallyPhase,uVar3,LVar4);
      if (bVar2) goto LAB_00c2a033;
    }
    AllocateLoopHeaders(this);
  }
LAB_00c2a033:
  FunctionBody::MarkScript
            (this->m_functionWrite,(ByteBlock *)scriptContext,finalAuxiliaryContextBlock,local_98,
             this->m_byteCodeCount,this->m_byteCodeInLoopCount,this->m_byteCodeWithoutLDACount);
  FunctionBody::LoadDynamicProfileInfo(this->m_functionWrite);
  Reset(this);
  return;
}

Assistant:

void ByteCodeWriter::End()
#endif
    {
        Assert(isInUse);

        CheckOpen();
        Empty(OpCode::EndOfBlock);

        ByteBlock* finalByteCodeBlock = nullptr;

        ScriptContext* scriptContext = m_functionWrite->GetScriptContext();
        m_byteCodeData.Copy(scriptContext->GetRecycler(), &finalByteCodeBlock);

        byte * byteBuffer = finalByteCodeBlock->GetBuffer();
        uint byteCount = m_byteCodeData.GetCurrentOffset();

        //
        // Update all branch targets with their actual label destinations.
        //
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            PatchJumpOffset<JumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
            PatchJumpOffset<LongJumpOffset>(m_longJumpOffsets, byteBuffer, byteCount);
        }
        else
        {
            PatchJumpOffset<LongJumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
        }
#else
        PatchJumpOffset<JumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
#endif

        // Patch up the root object load inline cache with the start index
        uint rootObjectLoadInlineCacheStart = this->m_functionWrite->GetRootObjectLoadInlineCacheStart();
        rootObjectLoadInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectLoadInlineCacheStart;
        });

        // Patch up the root object load method inline cache with the start index
        uint rootObjectLoadMethodInlineCacheStart = this->m_functionWrite->GetRootObjectLoadMethodInlineCacheStart();
        rootObjectLoadMethodInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectLoadMethodInlineCacheStart;
        });

        // Patch up the root object store inline cache with the start index
        uint rootObjectStoreInlineCacheStart = this->m_functionWrite->GetRootObjectStoreInlineCacheStart();
        rootObjectStoreInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectStoreInlineCacheStart;
        });

        //
        // Store the final trimmed byte-code on the function.
        //
        ByteBlock* finalAuxiliaryBlock = nullptr;
        ByteBlock* finalAuxiliaryContextBlock = nullptr;

        m_auxiliaryData.Copy(m_functionWrite->GetScriptContext()->GetRecycler(), &finalAuxiliaryBlock);
        m_auxContextData.Copy(m_functionWrite->GetScriptContext()->GetRecycler(), &finalAuxiliaryContextBlock);

        m_functionWrite->AllocateInlineCache();
        m_functionWrite->AllocateObjectLiteralTypeArray();
        m_functionWrite->AllocateForInCache();

        if (!PHASE_OFF(Js::ScriptFunctionWithInlineCachePhase, m_functionWrite) && !PHASE_OFF(Js::InlineApplyTargetPhase, m_functionWrite))
        {
            if (m_functionWrite->CanFunctionObjectHaveInlineCaches())
            {
                m_functionWrite->SetInlineCachesOnFunctionObject(true);
            }
        }

        if (this->DoJitLoopBodies() && this->HasLoopWithoutYield() &&
            !(this->m_functionWrite->GetFunctionBody()->GetHasTry() && PHASE_OFF(Js::JITLoopBodyInTryCatchPhase, this->m_functionWrite)) &&
            !(this->m_functionWrite->GetFunctionBody()->GetHasFinally() && PHASE_OFF(Js::JITLoopBodyInTryFinallyPhase, this->m_functionWrite)))
        {
            AllocateLoopHeaders();
        }

        m_functionWrite->MarkScript(finalByteCodeBlock, finalAuxiliaryBlock, finalAuxiliaryContextBlock,
            m_byteCodeCount, m_byteCodeInLoopCount, m_byteCodeWithoutLDACount);

#if ENABLE_PROFILE_INFO
        m_functionWrite->LoadDynamicProfileInfo();
#endif

        JS_ETW(EventWriteJSCRIPT_BYTECODEGEN_METHOD(m_functionWrite->GetHostSourceContext(), m_functionWrite->GetScriptContext(), m_functionWrite->GetLocalFunctionId(), m_functionWrite->GetByteCodeCount(), this->GetTotalSize(), m_functionWrite->GetExternalDisplayName()));

#ifdef LOG_BYTECODE_AST_RATIO
        // log the bytecode AST ratio
        if (currentAstSize == maxAstSize)
        {
            float astBytecodeRatio = (float)currentAstSize / (float)byteCount;
            Output::Print(_u("\tAST Bytecode ratio: %f\n"), astBytecodeRatio);
        }
#endif

        // TODO: add validation for source mapping under #dbg
        //
        // Reset the writer to prepare for the next user.
        //

        Reset();
    }